

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

void google::protobuf::internal::OnShutdownRun(_func_void_void_ptr *f,void *arg)

{
  MutexLock this;
  pair<void_(*)(const_void_*),_const_void_*> local_38;
  MutexLock local_28;
  MutexLock lock;
  ShutdownData *shutdown_data;
  void *arg_local;
  _func_void_void_ptr *f_local;
  
  shutdown_data = (ShutdownData *)arg;
  arg_local = f;
  lock.mu_ = (Mutex *)ShutdownData::get();
  absl::lts_20250127::MutexLock::MutexLock(&local_28,&((ShutdownData *)lock.mu_)->mutex);
  this.mu_ = lock.mu_;
  local_38 = std::make_pair<void(*&)(void_const*),void_const*&>
                       ((_func_void_void_ptr **)&arg_local,&shutdown_data);
  std::
  vector<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
  ::push_back((vector<std::pair<void_(*)(const_void_*),_const_void_*>,_std::allocator<std::pair<void_(*)(const_void_*),_const_void_*>_>_>
               *)this.mu_,&local_38);
  absl::lts_20250127::MutexLock::~MutexLock(&local_28);
  return;
}

Assistant:

void OnShutdownRun(void (*f)(const void*), const void* arg) {
  auto shutdown_data = ShutdownData::get();
  absl::MutexLock lock(&shutdown_data->mutex);
  shutdown_data->functions.push_back(std::make_pair(f, arg));
}